

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void freeobj(lua_State *L,GCObject *o)

{
  GCObject *o_local;
  lua_State *L_local;
  
  switch(o->tt) {
  case '\x04':
    luaS_remove(L,(TString *)o);
    luaM_realloc_(L,o,(long)(int)((byte)o->field_0xb + 1) + 0x18,0);
    break;
  case '\x05':
    luaH_free(L,(Table *)o);
    break;
  case '\x06':
    freeLclosure(L,(LClosure *)o);
    break;
  case '\a':
    luaM_realloc_(L,o,*(long *)&o[1].tt + 0x28,0);
    break;
  case '\b':
    luaE_freethread(L,(lua_State *)o);
    break;
  case '\t':
    luaF_freeproto(L,(Proto *)o);
    break;
  default:
    break;
  case '\x14':
    luaM_realloc_(L,o,(size_t)&o[1].next[1].marked,0);
    break;
  case '&':
    luaM_realloc_(L,o,(long)(int)(((byte)o->field_0xa - 1) * 0x10 + 0x30),0);
  }
  return;
}

Assistant:

static void freeobj (lua_State *L, GCObject *o) {
  switch (o->tt) {
    case LUA_TPROTO: luaF_freeproto(L, gco2p(o)); break;
    case LUA_TLCL: {
      freeLclosure(L, gco2lcl(o));
      break;
    }
    case LUA_TCCL: {
      luaM_freemem(L, o, sizeCclosure(gco2ccl(o)->nupvalues));
      break;
    }
    case LUA_TTABLE: luaH_free(L, gco2t(o)); break;
    case LUA_TTHREAD: luaE_freethread(L, gco2th(o)); break;
    case LUA_TUSERDATA: luaM_freemem(L, o, sizeudata(gco2u(o))); break;
    case LUA_TSHRSTR:
      luaS_remove(L, gco2ts(o));  /* remove it from hash table */
      luaM_freemem(L, o, sizelstring(gco2ts(o)->shrlen));
      break;
    case LUA_TLNGSTR: {
      luaM_freemem(L, o, sizelstring(gco2ts(o)->u.lnglen));
      break;
    }
    default: lua_assert(0);
  }
}